

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void loop_(PDISASM pMyDisasm)

{
  int iVar1;
  ulong local_20;
  UInt64 MyAddress;
  long MyNumber;
  PDISASM pMyDisasm_local;
  
  (pMyDisasm->Instruction).Category = 0x10006;
  (pMyDisasm->Instruction).BranchType = 3;
  MyNumber = (long)pMyDisasm;
  strcpy((pMyDisasm->Instruction).Mnemonic,"loop");
  iVar1 = Security(2,(PDISASM)MyNumber);
  if (iVar1 != 0) {
    if (*(int *)(MyNumber + 0x8c0) < 0x20) {
      MyAddress = (UInt64)*(char *)(*(long *)(MyNumber + 0x8a4) + 1);
      CalculateRelativeAddress
                (&local_20,(long)*(int *)(MyNumber + 0x904) + 2 + MyAddress,(PDISASM)MyNumber);
      local_20 = local_20 & 0xffff;
      CopyFormattedNumber((PDISASM)MyNumber,(char *)(MyNumber + 0x1a0),"%.4X",local_20);
      *(undefined4 *)(MyNumber + 0x1c8) = 1;
      *(undefined4 *)(MyNumber + 0x1c0) = 8;
      *(undefined8 *)(MyNumber + 0x1b8) = 0x4040000;
      *(undefined8 *)(MyNumber + 0xb0) = 1;
      *(undefined8 *)(MyNumber + 0xb8) = 2;
      *(ulong *)(MyNumber + 0xa0) = local_20;
      *(long *)(MyNumber + 0x8a4) = *(long *)(MyNumber + 0x8a4) + 2;
      FillFlags((PDISASM)MyNumber,0x3c);
    }
    else {
      MyAddress = (UInt64)*(char *)(*(long *)(MyNumber + 0x8a4) + 1);
      CalculateRelativeAddress
                (&local_20,(long)*(int *)(MyNumber + 0x904) + 2 + MyAddress,(PDISASM)MyNumber);
      if (local_20 < 0x100000000) {
        CopyFormattedNumber((PDISASM)MyNumber,(char *)(MyNumber + 0x1a0),"%.8X",local_20);
      }
      else {
        CopyFormattedNumber((PDISASM)MyNumber,(char *)(MyNumber + 0x1a0),"%.16llX",local_20);
      }
      *(undefined4 *)(MyNumber + 0x1c8) = 1;
      *(undefined4 *)(MyNumber + 0x1c0) = 8;
      *(undefined8 *)(MyNumber + 0x1b8) = 0x4040000;
      *(undefined8 *)(MyNumber + 0xb0) = 1;
      *(undefined8 *)(MyNumber + 0xb8) = 2;
      *(ulong *)(MyNumber + 0xa0) = local_20;
      *(long *)(MyNumber + 0x8a4) = *(long *)(MyNumber + 0x8a4) + 2;
      FillFlags((PDISASM)MyNumber,0x3c);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ loop_(PDISASM pMyDisasm)
{
    signed long MyNumber;
    UInt64 MyAddress;
    pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+CONTROL_TRANSFER;
    pMyDisasm->Instruction.BranchType = JE;
    #ifndef BEA_LIGHT_DISASSEMBLY
       (void) strcpy (pMyDisasm->Instruction.Mnemonic, "loop");
    #endif
    if (!Security(2, pMyDisasm)) return;
    if (GV.OperandSize >= 32) {
      MyNumber = *((Int8*) (GV.EIP_+1));
      CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
      if (MyAddress >= W64LIT (0x100000000)) {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.16llX",(Int64) MyAddress);
          #endif
      }
      else {
          #ifndef BEA_LIGHT_DISASSEMBLY
             (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.8X",(Int64) MyAddress);
          #endif
      }
      pMyDisasm->Operand1.AccessMode = READ;
      pMyDisasm->Operand1.OpSize = 8;
      pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
      pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
      pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG1;
      pMyDisasm->Instruction.AddrValue = MyAddress;
      GV.EIP_+=2;
      FillFlags(pMyDisasm, 60);
    }
    else {
      MyNumber = *((Int8*) (GV.EIP_+1));
      CalculateRelativeAddress(&MyAddress,(Int64) GV.NB_PREFIX+2+MyNumber, pMyDisasm);
      MyAddress = MyAddress & 0xffff;
      #ifndef BEA_LIGHT_DISASSEMBLY
         (void) CopyFormattedNumber(pMyDisasm, (char*) pMyDisasm->Operand1.OpMnemonic, "%.4X",(Int64) MyAddress);
      #endif
      pMyDisasm->Operand1.AccessMode = READ;
      pMyDisasm->Operand1.OpSize = 8;
      pMyDisasm->Operand1.OpType = CONSTANT_TYPE+RELATIVE_;
      pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
      pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG1;
      pMyDisasm->Instruction.AddrValue = MyAddress;
      GV.EIP_+=2;
      FillFlags(pMyDisasm, 60);
    }
}